

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O1

QString * __thiscall
QFileSystemComboBox::currentFileName(QString *__return_storage_ptr__,QFileSystemComboBox *this)

{
  QFileInfo local_30 [8];
  QArrayDataPointer<char16_t> local_28;
  
  currentFilePath((QString *)&local_28,this);
  QFileInfo::QFileInfo(local_30,(QString *)&local_28);
  QFileInfo::fileName();
  QFileInfo::~QFileInfo(local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemComboBox::currentFileName() const {
    return QFileInfo(currentFilePath()).fileName();
}